

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O1

void __thiscall QPushButton::mouseMoveEvent(QPushButton *this,QMouseEvent *e)

{
  long lVar1;
  QWidgetData *pQVar2;
  bool bVar3;
  char cVar4;
  undefined4 uVar5;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar8 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar9 [16];
  QRect local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  bVar3 = QWidget::testAttribute_helper((QWidget *)this,WA_Hover);
  if (bVar3) {
    cVar4 = '\0';
    if ((((this->super_QAbstractButton).super_QWidget.data)->widget_attributes & 2) != 0) {
      uVar5 = QEventPoint::position();
      auVar9._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                     extraout_XMM1_Qa;
      auVar9._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                     extraout_XMM0_Qa;
      auVar9 = minpd(_DAT_0066f5d0,auVar9);
      auVar8._8_8_ = -(ulong)(-2147483648.0 < auVar9._8_8_);
      auVar8._0_8_ = -(ulong)(-2147483648.0 < auVar9._0_8_);
      uVar6 = movmskpd(uVar5,auVar8);
      uVar7 = 0x8000000000000000;
      if ((uVar6 & 1) != 0) {
        uVar7 = (ulong)(uint)(int)auVar9._0_8_ << 0x20;
      }
      local_38._0_8_ = 0x80000000;
      if ((uVar6 & 2) != 0) {
        local_38._0_8_ = (ulong)(uint)(int)auVar9._8_8_;
      }
      local_38._0_8_ = local_38._0_8_ | uVar7;
      cVar4 = (**(code **)(*(long *)&(this->super_QAbstractButton).super_QWidget + 0x1a0))(this);
    }
    if ((bool)cVar4 != ((*(uint *)(lVar1 + 0x2c8) >> 5 & 1) != 0)) {
      pQVar2 = (this->super_QAbstractButton).super_QWidget.data;
      local_38.x2.m_i = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
      local_38.y2.m_i = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
      local_38.x1.m_i = 0;
      local_38.y1.m_i = 0;
      QWidget::update((QWidget *)this,&local_38);
      *(byte *)(lVar1 + 0x2c8) = *(byte *)(lVar1 + 0x2c8) & 0xdf | cVar4 << 5;
    }
  }
  QAbstractButton::mouseMoveEvent(&this->super_QAbstractButton,e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPushButton::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QPushButton);

    if (testAttribute(Qt::WA_Hover)) {
        bool hit = false;
        if (underMouse())
            hit = hitButton(e->position().toPoint());

        if (hit != d->hovering) {
            update(rect());
            d->hovering = hit;
        }
    }

    QAbstractButton::mouseMoveEvent(e);
}